

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

ssize_t __thiscall icu_63::VTZReader::read(VTZReader *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int32_t iVar2;
  char16_t local_12;
  UChar ch;
  VTZReader *this_local;
  
  local_12 = L'\xffff';
  iVar1 = this->index;
  iVar2 = UnicodeString::length(this->in);
  if (iVar1 < iVar2) {
    local_12 = UnicodeString::charAt(this->in,this->index);
  }
  this->index = this->index + 1;
  return CONCAT62((int6)((ulong)this >> 0x10),local_12);
}

Assistant:

UChar
VTZReader::read(void) {
    UChar ch = 0xFFFF;
    if (index < in->length()) {
        ch = in->charAt(index);
    }
    index++;
    return ch;
}